

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

TokenType __thiscall wabt::WastParser::Peek(WastParser *this,size_t n)

{
  Location loc;
  Token t;
  Token t_00;
  Token t_01;
  bool bVar1;
  TokenType TVar2;
  char *pcVar3;
  size_type sVar4;
  Token *this_00;
  bool local_229;
  Token local_1f0;
  int local_1ac;
  undefined8 uStack_1a8;
  int indent;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_168;
  basic_string_view<char,_std::char_traits<char>_> local_158;
  string_view local_148;
  size_t local_138;
  size_t local_130;
  char *local_128;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_120;
  Token local_118;
  string local_d8;
  size_t local_b8;
  size_t local_b0;
  char *local_a8;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 auStack_58 [8];
  Token cur;
  size_t n_local;
  WastParser *this_local;
  
  cur.field_2.literal_.text._M_str = (char *)n;
  if (1 < n) {
    __assert_fail("n <= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                  ,0x239,"TokenType wabt::WastParser::Peek(size_t)");
  }
LAB_002002f8:
  do {
    while( true ) {
      while( true ) {
        pcVar3 = (char *)TokenQueue::size(&this->tokens_);
        if (cur.field_2.literal_.text._M_str < pcVar3) {
          this_00 = TokenQueue::at(&this->tokens_,(size_t)cur.field_2.literal_.text._M_str);
          TVar2 = Token::token_type(this_00);
          return TVar2;
        }
        WastLexer::GetToken((Token *)auStack_58,this->lexer_);
        TVar2 = Token::token_type((Token *)auStack_58);
        if (TVar2 == LparAnn) break;
        memcpy(&local_98,auStack_58,0x40);
        t.loc.filename._M_str = (char *)uStack_90;
        t.loc.filename._M_len = local_98;
        t.loc.field_1.field_1.offset =
             (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
             (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_88;
        t.loc.field_1._8_8_ = uStack_80;
        t._32_8_ = local_78;
        t.field_2.text_._M_len = uStack_70;
        t.field_2.text_._M_str = (char *)local_68;
        t.field_2.literal_.text._M_str = (char *)uStack_60;
        TokenQueue::push_back(&this->tokens_,t);
      }
      bVar1 = Features::annotations_enabled(&this->options_->features);
      if (bVar1) break;
      local_b8 = (size_t)auStack_58;
      local_b0 = cur.loc.filename._M_len;
      local_a8 = cur.loc.filename._M_str;
      local_a0.offset = (size_t)cur.loc.field_1.field_1.offset;
      Token::to_string_abi_cxx11_(&local_d8,(Token *)auStack_58);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      Error(this,0x2bc513,pcVar3);
      std::__cxx11::string::~string((string *)&local_d8);
      local_138 = (size_t)auStack_58;
      local_130 = cur.loc.filename._M_len;
      local_128 = cur.loc.filename._M_str;
      local_120.offset = (size_t)cur.loc.field_1.field_1.offset;
      loc.filename._M_str = (char *)cur.loc.filename._M_len;
      loc.filename._M_len = (size_t)auStack_58;
      loc.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
           cur.loc.filename._M_str;
      loc.field_1._8_8_ = cur.loc.field_1.field_1.offset;
      Token::Token(&local_118,loc,First);
      t_00.loc.filename._M_str = local_118.loc.filename._M_str;
      t_00.loc.filename._M_len = local_118.loc.filename._M_len;
      t_00.loc.field_1.field_1.offset = local_118.loc.field_1.field_1.offset;
      t_00.loc.field_1._8_8_ = local_118.loc.field_1._8_8_;
      t_00.token_type_ = local_118.token_type_;
      t_00._36_4_ = local_118._36_4_;
      t_00.field_2.text_._M_len = local_118.field_2.text_._M_len;
      t_00.field_2.text_._M_str = local_118.field_2.text_._M_str;
      t_00.field_2.literal_.text._M_str = local_118.field_2.literal_.text._M_str;
      TokenQueue::push_back(&this->tokens_,t_00);
    }
    bVar1 = Features::code_metadata_enabled(&this->options_->features);
    if (bVar1) {
      local_148 = Token::text((Token *)auStack_58);
      sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find
                        (&local_148,"metadata.code.",0);
      local_229 = true;
      if (sVar4 != 0) goto LAB_00200548;
    }
    else {
LAB_00200548:
      local_158 = Token::text((Token *)auStack_58);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_168,"custom");
      local_229 = std::operator==(local_158,local_168);
    }
    if (local_229 == false) {
      local_1ac = 1;
LAB_00200615:
      do {
        if (local_1ac < 1) goto LAB_002002f8;
        WastLexer::GetToken(&local_1f0,this->lexer_);
        cur.field_2.type_ = local_1f0.field_2._8_8_;
        cur.field_2.text_._M_str = local_1f0.field_2.literal_.text._M_str;
        cur.loc.field_1._8_8_ = local_1f0._32_8_;
        cur._32_8_ = local_1f0.field_2.text_._M_len;
        cur.loc.filename._M_str = (char *)local_1f0.loc.field_1.field_1.offset;
        cur.loc.field_1.field_1.offset =
             (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
             (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
             local_1f0.loc.field_1._8_8_;
        auStack_58 = (undefined1  [8])local_1f0.loc.filename._M_len;
        cur.loc.filename._M_len = (size_t)local_1f0.loc.filename._M_str;
        TVar2 = Token::token_type((Token *)auStack_58);
        if (TVar2 != Eof) {
          if (TVar2 != Lpar) {
            if (TVar2 == Rpar) {
              local_1ac = local_1ac + -1;
              goto LAB_00200615;
            }
            if (TVar2 != LparAnn) goto LAB_00200615;
          }
          local_1ac = local_1ac + 1;
          goto LAB_00200615;
        }
        local_1ac = 0;
        Error(this,0x2bc536);
      } while( true );
    }
    memcpy(&stack0xfffffffffffffe58,auStack_58,0x40);
    t_01.loc.filename._M_str = (char *)uStack_1a0;
    t_01.loc.filename._M_len = uStack_1a8;
    t_01.loc.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_198;
    t_01.loc.field_1._8_8_ = uStack_190;
    t_01._32_8_ = local_188;
    t_01.field_2.text_._M_len = uStack_180;
    t_01.field_2.text_._M_str = (char *)local_178;
    t_01.field_2.literal_.text._M_str = (char *)uStack_170;
    TokenQueue::push_back(&this->tokens_,t_01);
  } while( true );
}

Assistant:

TokenType WastParser::Peek(size_t n) {
  assert(n <= 1);
  while (tokens_.size() <= n) {
    Token cur = lexer_->GetToken();
    if (cur.token_type() != TokenType::LparAnn) {
      tokens_.push_back(cur);
    } else {
      // Custom annotation. For now, discard until matching Rpar, unless it is
      // a code metadata annotation or custom section. In those cases, we know
      // how to parse it.
      if (!options_->features.annotations_enabled()) {
        Error(cur.loc, "annotations not enabled: %s", cur.to_string().c_str());
        tokens_.push_back(Token(cur.loc, TokenType::Invalid));
        continue;
      }
      if ((options_->features.code_metadata_enabled() &&
           cur.text().find("metadata.code.") == 0) ||
          cur.text() == "custom") {
        tokens_.push_back(cur);
        continue;
      }
      int indent = 1;
      while (indent > 0) {
        cur = lexer_->GetToken();
        switch (cur.token_type()) {
          case TokenType::Lpar:
          case TokenType::LparAnn:
            indent++;
            break;

          case TokenType::Rpar:
            indent--;
            break;

          case TokenType::Eof:
            indent = 0;
            Error(cur.loc, "unterminated annotation");
            break;

          default:
            break;
        }
      }
    }
  }
  return tokens_.at(n).token_type();
}